

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  char **ppcVar2;
  int *piVar3;
  int local_14;
  int len;
  int i;
  xmlSaveCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    if ((ctxt->encoding == (xmlChar *)0x0) && (ctxt->escape == (xmlCharEncodingOutputFunc)0x0)) {
      ctxt->escape = xmlEscapeEntities;
    }
    ppcVar2 = __xmlTreeIndentString();
    iVar1 = xmlStrlen((xmlChar *)*ppcVar2);
    ppcVar2 = __xmlTreeIndentString();
    if ((*ppcVar2 == (char *)0x0) || (iVar1 == 0)) {
      memset(ctxt->indent,0,0x3d);
    }
    else {
      ctxt->indent_size = iVar1;
      ctxt->indent_nr = (int)(0x3c / (long)ctxt->indent_size);
      for (local_14 = 0; local_14 < ctxt->indent_nr; local_14 = local_14 + 1) {
        iVar1 = ctxt->indent_size;
        ppcVar2 = __xmlTreeIndentString();
        memcpy(ctxt->indent + local_14 * iVar1,*ppcVar2,(long)ctxt->indent_size);
      }
      ctxt->indent[ctxt->indent_nr * ctxt->indent_size] = '\0';
    }
    piVar3 = __xmlSaveNoEmptyTags();
    if (*piVar3 != 0) {
      ctxt->options = ctxt->options | 4;
    }
  }
  return;
}

Assistant:

static void
xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt)
{
    int i;
    int len;

    if (ctxt == NULL) return;
    if ((ctxt->encoding == NULL) && (ctxt->escape == NULL))
        ctxt->escape = xmlEscapeEntities;
    len = xmlStrlen((xmlChar *)xmlTreeIndentString);
    if ((xmlTreeIndentString == NULL) || (len == 0)) {
        memset(&ctxt->indent[0], 0, MAX_INDENT + 1);
    } else {
	ctxt->indent_size = len;
	ctxt->indent_nr = MAX_INDENT / ctxt->indent_size;
	for (i = 0;i < ctxt->indent_nr;i++)
	    memcpy(&ctxt->indent[i * ctxt->indent_size], xmlTreeIndentString,
		   ctxt->indent_size);
        ctxt->indent[ctxt->indent_nr * ctxt->indent_size] = 0;
    }

    if (xmlSaveNoEmptyTags) {
	ctxt->options |= XML_SAVE_NO_EMPTY;
    }
}